

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

CURLcode doh_run_probe(Curl_easy *data,doh_probe *p,DNStype dnstype,char *host,char *url,
                      CURLM *multi,curl_slist *headers)

{
  undefined1 *puVar1;
  FILE *pFVar2;
  curl_trc_feat *pcVar3;
  bool bVar4;
  CURLcode CVar5;
  CURLMcode CVar6;
  size_t sVar7;
  char *pcVar8;
  timediff_t tVar9;
  undefined8 uVar10;
  uchar *puVar11;
  Curl_easy *local_60;
  DNStype local_54;
  Curl_easy *local_50;
  uchar *local_48;
  CURLM *local_40;
  char *local_38;
  
  local_60 = (Curl_easy *)0x0;
  local_48 = p->req_body;
  local_54 = dnstype;
  local_40 = multi;
  local_38 = url;
  sVar7 = strlen(host);
  if ((sVar7 - (host[sVar7 - 1] == '.')) + 0x12 < 0x111) {
    p->req_body[0] = '\0';
    p->req_body[1] = '\0';
    p->req_body[2] = '\x01';
    p->req_body[3] = '\0';
    p->req_body[4] = '\0';
    p->req_body[5] = '\x01';
    puVar11 = p->req_body + 0xc;
    p->req_body[6] = '\0';
    p->req_body[7] = '\0';
    p->req_body[8] = '\0';
    p->req_body[9] = '\0';
    p->req_body[10] = '\0';
    p->req_body[0xb] = '\0';
    local_50 = data;
    for (; *host != '\0'; host = host + ((sVar7 + 1) - (ulong)(pcVar8 == (char *)0x0))) {
      pcVar8 = strchr(host,0x2e);
      if (pcVar8 == (char *)0x0) {
        sVar7 = strlen(host);
      }
      else {
        sVar7 = (long)pcVar8 - (long)host;
      }
      if (0x3e < sVar7 - 1) {
        p->req_body_len = 0;
        uVar10 = 1;
        bVar4 = false;
        data = local_50;
        goto LAB_0012510c;
      }
      *puVar11 = (uchar)sVar7;
      memcpy(puVar11 + 1,host,sVar7);
      puVar11 = puVar11 + sVar7 + 1;
    }
    puVar11[0] = '\0';
    puVar11[1] = '\0';
    puVar11[2] = (uchar)local_54;
    puVar11[3] = '\0';
    puVar11[4] = '\x01';
    p->req_body_len = (size_t)(puVar11 + (5 - (long)local_48));
    uVar10 = 0;
    bVar4 = true;
    data = local_50;
  }
  else {
    uVar10 = 0xd;
    bVar4 = false;
  }
LAB_0012510c:
  if (bVar4) {
    p->dnstype = local_54;
    Curl_dyn_init(&p->resp_body,3000);
    tVar9 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar9 < 1) {
      CVar5 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      CVar5 = Curl_open(&local_60);
      if (CVar5 == CURLE_OK) {
        puVar1 = &(local_60->state).field_0x7be;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x100000;
        (local_60->state).feat = &Curl_trc_feat_dns;
        CVar5 = curl_easy_setopt(local_60,CURLOPT_URL,local_38);
        if (((((((CVar5 < CURLE_SETOPT_OPTION_SYNTAX) &&
                ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)) &&
               (CVar5 = curl_easy_setopt(local_60,CURLOPT_DEFAULT_PROTOCOL,"https"),
               CVar5 < CURLE_SETOPT_OPTION_SYNTAX)) &&
              (((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0 &&
               (CVar5 = curl_easy_setopt(local_60,CURLOPT_WRITEFUNCTION,doh_write_cb),
               CVar5 < CURLE_SETOPT_OPTION_SYNTAX)))) &&
             ((((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0 &&
               ((CVar5 = curl_easy_setopt(local_60,CURLOPT_WRITEDATA,&p->resp_body),
                CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))) &&
              (CVar5 = curl_easy_setopt(local_60,CURLOPT_POSTFIELDS,local_48),
              CVar5 < CURLE_SETOPT_OPTION_SYNTAX)))) &&
            (((((((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0 &&
                 (CVar5 = curl_easy_setopt(local_60,CURLOPT_POSTFIELDSIZE,p->req_body_len),
                 CVar5 < CURLE_SETOPT_OPTION_SYNTAX)) &&
                ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)) &&
               (((CVar5 = curl_easy_setopt(local_60,CURLOPT_HTTPHEADER,headers),
                 CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                 ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)) &&
                ((CVar5 = curl_easy_setopt(local_60,CURLOPT_PROTOCOLS,2),
                 CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                 (((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0 &&
                  (CVar5 = curl_easy_setopt(local_60,CURLOPT_TIMEOUT_MS,tVar9),
                  CVar5 < CURLE_SETOPT_OPTION_SYNTAX)))))))) &&
              ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)) &&
             ((CVar5 = curl_easy_setopt(local_60,CURLOPT_SHARE,data->share),
              CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
              ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))))) &&
           (((((pFVar2 = (data->set).err, pFVar2 == (FILE *)0x0 || (pFVar2 == _stderr)) ||
              ((CVar5 = curl_easy_setopt(local_60,CURLOPT_STDERR),
               CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
               ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))) &&
             ((((data == (Curl_easy *)0x0 ||
                ((((data->set).field_0x897 & 0x40) == 0 ||
                 (((pcVar3 = (data->state).feat, pcVar3 != (curl_trc_feat *)0x0 &&
                   (pcVar3->log_level < 1)) || (Curl_trc_feat_dns.log_level < 1)))))) ||
               ((CVar5 = curl_easy_setopt(local_60,CURLOPT_VERBOSE,1),
                CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))) &&
              (((((data->set).field_0x898 & 2) == 0 ||
                ((CVar5 = curl_easy_setopt(local_60,CURLOPT_NOSIGNAL,1),
                 CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                 ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))) &&
               ((((CVar5 = curl_easy_setopt(local_60,CURLOPT_SSL_VERIFYHOST,
                                            (ulong)((uint)((ulong)*(undefined8 *)
                                                                   &(data->set).field_0x894 >> 0x33)
                                                   & 2)), CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                  (((((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0 &&
                     (CVar5 = curl_easy_setopt(local_60,CURLOPT_SSL_VERIFYPEER,
                                               (ulong)((uint)((ulong)*(undefined8 *)
                                                                      &(data->set).field_0x894 >>
                                                             0x33) & 1)),
                     CVar5 < CURLE_SETOPT_OPTION_SYNTAX)) &&
                    ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)) &&
                   ((CVar5 = curl_easy_setopt(local_60,CURLOPT_SSL_VERIFYSTATUS,
                                              (ulong)((uint)((ulong)*(undefined8 *)
                                                                     &(data->set).field_0x894 >>
                                                            0x35) & 1)),
                    CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                    ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))))) &&
                 ((((data->set).ssl.field_0xc0 & 2) == 0 ||
                  ((CVar5 = curl_easy_setopt(local_60,CURLOPT_SSL_FALSESTART,1),
                   CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                   ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))))) &&
                (((data->set).str[6] == (char *)0x0 ||
                 ((CVar5 = curl_easy_setopt(local_60,CURLOPT_CAINFO),
                  CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                  ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))))))))))) &&
            ((((((data->set).blobs[3] == (curl_blob *)0x0 ||
                ((CVar5 = curl_easy_setopt(local_60,CURLOPT_CAINFO_BLOB),
                 CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                 ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))) &&
               (((((data->set).str[5] == (char *)0x0 ||
                  ((CVar5 = curl_easy_setopt(local_60,CURLOPT_CAPATH),
                   CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                   ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))) &&
                 (((data->set).str[10] == (char *)0x0 ||
                  ((CVar5 = curl_easy_setopt(local_60,CURLOPT_CRLFILE),
                   CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                   ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))))) &&
                (((((data->set).ssl.field_0xc0 & 1) == 0 ||
                  ((CVar5 = curl_easy_setopt(local_60,CURLOPT_CERTINFO,1),
                   CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                   ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))) &&
                 (((data->set).ssl.fsslctx == (curl_ssl_ctx_callback)0x0 ||
                  ((CVar5 = curl_easy_setopt(local_60,CURLOPT_SSL_CTX_FUNCTION),
                   CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                   ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))))))))) &&
              (((((data->set).ssl.fsslctxp == (void *)0x0 ||
                 ((CVar5 = curl_easy_setopt(local_60,CURLOPT_SSL_CTX_DATA),
                  CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                  ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))) &&
                (((data->set).fdebug == (curl_debug_callback)0x0 ||
                 ((CVar5 = curl_easy_setopt(local_60,CURLOPT_DEBUGFUNCTION),
                  CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                  ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))))) &&
               (((data->set).debugdata == (void *)0x0 ||
                ((CVar5 = curl_easy_setopt(local_60,CURLOPT_DEBUGDATA),
                 CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
                 ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))))))) &&
             (((data->set).str[0x43] == (char *)0x0 ||
              ((CVar5 = curl_easy_setopt(local_60,CURLOPT_SSL_EC_CURVES),
               CVar5 < CURLE_SETOPT_OPTION_SYNTAX &&
               ((0x1000000000011U >> ((ulong)CVar5 & 0x3f) & 1) != 0)))))))))) {
          curl_easy_setopt(local_60,CURLOPT_SSL_OPTIONS,
                           (ulong)(*(ushort *)&(data->set).ssl.field_0xc0 >> 3 & 0x3f));
          (local_60->set).fmultidone = doh_done;
          (local_60->set).dohfor_mid = data->mid;
          CVar6 = curl_multi_add_handle(local_40,local_60);
          if (CVar6 == CURLM_OK) {
            p->easy_mid = local_60->mid;
            return CURLE_OK;
          }
        }
      }
    }
    Curl_close(&local_60);
    p->easy_mid = -1;
  }
  else {
    Curl_failf(data,"Failed to encode DoH packet [%d]",uVar10);
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  return CVar5;
}

Assistant:

static CURLcode doh_run_probe(struct Curl_easy *data,
                              struct doh_probe *p, DNStype dnstype,
                              const char *host,
                              const char *url, CURLM *multi,
                              struct curl_slist *headers)
{
  struct Curl_easy *doh = NULL;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  DOHcode d = doh_req_encode(host, dnstype, p->req_body, sizeof(p->req_body),
                             &p->req_body_len);
  if(d) {
    failf(data, "Failed to encode DoH packet [%d]", d);
    return CURLE_OUT_OF_MEMORY;
  }

  p->dnstype = dnstype;
  Curl_dyn_init(&p->resp_body, DYN_DOH_RESPONSE);

  timeout_ms = Curl_timeleft(data, NULL, TRUE);
  if(timeout_ms <= 0) {
    result = CURLE_OPERATION_TIMEDOUT;
    goto error;
  }
  /* Curl_open() is the internal version of curl_easy_init() */
  result = Curl_open(&doh);
  if(result)
    goto error;

  /* pass in the struct pointer via a local variable to please coverity and
     the gcc typecheck helpers */
  doh->state.internal = TRUE;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  doh->state.feat = &Curl_trc_feat_dns;
#endif
  ERROR_CHECK_SETOPT(CURLOPT_URL, url);
  ERROR_CHECK_SETOPT(CURLOPT_DEFAULT_PROTOCOL, "https");
  ERROR_CHECK_SETOPT(CURLOPT_WRITEFUNCTION, doh_write_cb);
  ERROR_CHECK_SETOPT(CURLOPT_WRITEDATA, &p->resp_body);
  ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDS, p->req_body);
  ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDSIZE, (long)p->req_body_len);
  ERROR_CHECK_SETOPT(CURLOPT_HTTPHEADER, headers);
#ifdef USE_HTTP2
  ERROR_CHECK_SETOPT(CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_2TLS);
  ERROR_CHECK_SETOPT(CURLOPT_PIPEWAIT, 1L);
#endif
#ifndef DEBUGBUILD
  /* enforce HTTPS if not debug */
  ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTPS);
#else
  /* in debug mode, also allow http */
  ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTP|CURLPROTO_HTTPS);
#endif
  ERROR_CHECK_SETOPT(CURLOPT_TIMEOUT_MS, (long)timeout_ms);
  ERROR_CHECK_SETOPT(CURLOPT_SHARE, (CURLSH *)data->share);
  if(data->set.err && data->set.err != stderr)
    ERROR_CHECK_SETOPT(CURLOPT_STDERR, data->set.err);
  if(Curl_trc_ft_is_verbose(data, &Curl_trc_feat_dns))
    ERROR_CHECK_SETOPT(CURLOPT_VERBOSE, 1L);
  if(data->set.no_signal)
    ERROR_CHECK_SETOPT(CURLOPT_NOSIGNAL, 1L);

  ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYHOST,
    data->set.doh_verifyhost ? 2L : 0L);
  ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYPEER,
    data->set.doh_verifypeer ? 1L : 0L);
  ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYSTATUS,
    data->set.doh_verifystatus ? 1L : 0L);

  /* Inherit *some* SSL options from the user's transfer. This is a
     best-guess as to which options are needed for compatibility. #3661

     Note DoH does not inherit the user's proxy server so proxy SSL settings
     have no effect and are not inherited. If that changes then two new
     options should be added to check doh proxy insecure separately,
     CURLOPT_DOH_PROXY_SSL_VERIFYHOST and CURLOPT_DOH_PROXY_SSL_VERIFYPEER.
     */
  if(data->set.ssl.falsestart)
    ERROR_CHECK_SETOPT(CURLOPT_SSL_FALSESTART, 1L);
  if(data->set.str[STRING_SSL_CAFILE]) {
    ERROR_CHECK_SETOPT(CURLOPT_CAINFO,
                       data->set.str[STRING_SSL_CAFILE]);
  }
  if(data->set.blobs[BLOB_CAINFO]) {
    ERROR_CHECK_SETOPT(CURLOPT_CAINFO_BLOB,
                       data->set.blobs[BLOB_CAINFO]);
  }
  if(data->set.str[STRING_SSL_CAPATH]) {
    ERROR_CHECK_SETOPT(CURLOPT_CAPATH,
                       data->set.str[STRING_SSL_CAPATH]);
  }
  if(data->set.str[STRING_SSL_CRLFILE]) {
    ERROR_CHECK_SETOPT(CURLOPT_CRLFILE,
                       data->set.str[STRING_SSL_CRLFILE]);
  }
  if(data->set.ssl.certinfo)
    ERROR_CHECK_SETOPT(CURLOPT_CERTINFO, 1L);
  if(data->set.ssl.fsslctx)
    ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_FUNCTION, data->set.ssl.fsslctx);
  if(data->set.ssl.fsslctxp)
    ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_DATA, data->set.ssl.fsslctxp);
  if(data->set.fdebug)
    ERROR_CHECK_SETOPT(CURLOPT_DEBUGFUNCTION, data->set.fdebug);
  if(data->set.debugdata)
    ERROR_CHECK_SETOPT(CURLOPT_DEBUGDATA, data->set.debugdata);
  if(data->set.str[STRING_SSL_EC_CURVES]) {
    ERROR_CHECK_SETOPT(CURLOPT_SSL_EC_CURVES,
                       data->set.str[STRING_SSL_EC_CURVES]);
  }

  {
    long mask =
      (data->set.ssl.enable_beast ?
       CURLSSLOPT_ALLOW_BEAST : 0) |
      (data->set.ssl.no_revoke ?
       CURLSSLOPT_NO_REVOKE : 0) |
      (data->set.ssl.no_partialchain ?
       CURLSSLOPT_NO_PARTIALCHAIN : 0) |
      (data->set.ssl.revoke_best_effort ?
       CURLSSLOPT_REVOKE_BEST_EFFORT : 0) |
      (data->set.ssl.native_ca_store ?
       CURLSSLOPT_NATIVE_CA : 0) |
      (data->set.ssl.auto_client_cert ?
       CURLSSLOPT_AUTO_CLIENT_CERT : 0);

    (void)curl_easy_setopt(doh, CURLOPT_SSL_OPTIONS, mask);
  }

  doh->set.fmultidone = doh_done;
  doh->set.dohfor_mid = data->mid; /* for which transfer this is done */

  /* DoH handles must not inherit private_data. The handles may be passed to
     the user via callbacks and the user will be able to identify them as
     internal handles because private data is not set. The user can then set
     private_data via CURLOPT_PRIVATE if they so choose. */
  DEBUGASSERT(!doh->set.private_data);

  if(curl_multi_add_handle(multi, doh))
    goto error;

  p->easy_mid = doh->mid;
  return CURLE_OK;

error:
  Curl_close(&doh);
  p->easy_mid = -1;
  return result;
}